

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  Shape *shape;
  allocator local_79;
  Image render;
  Scene local_68;
  string local_28;
  
  local_68.camera.origin.x = 0.0;
  local_68.camera.origin.y = 0.0;
  local_68.camera.origin.z = 0.0;
  local_68.lights.super__Vector_base<Raytracer::Light,_std::allocator<Raytracer::Light>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.lights.super__Vector_base<Raytracer::Light,_std::allocator<Raytracer::Light>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  local_68.lights.super__Vector_base<Raytracer::Light,_std::allocator<Raytracer::Light>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  local_68.objects.super__Vector_base<Raytracer::Shape_*,_std::allocator<Raytracer::Shape_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.lights.super__Vector_base<Raytracer::Light,_std::allocator<Raytracer::Light>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.objects.super__Vector_base<Raytracer::Shape_*,_std::allocator<Raytracer::Shape_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.objects.super__Vector_base<Raytracer::Shape_*,_std::allocator<Raytracer::Shape_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.camera.fov = 1.0471976;
  shape = (Shape *)operator_new(0x18);
  shape->_vptr_Shape = (_func_int **)&PTR__Sphere_00104d80;
  shape[1]._vptr_Shape = (_func_int **)0x0;
  shape[2]._vptr_Shape = (_func_int **)0x41200000c25c0000;
  Raytracer::Scene::addObject(&local_68,shape);
  Raytracer::Image::Image(&render,1000,1000);
  Raytracer::Scene::start(&local_68,&render);
  std::__cxx11::string::string((string *)&local_28,"./file1.ppm",&local_79);
  Raytracer::Image::Save(&render,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  Raytracer::Image::~Image(&render);
  Raytracer::Scene::~Scene(&local_68);
  return 0;
}

Assistant:

int main() {
    Raytracer::Scene scene(Raytracer::Camera(Vec3f(0,0,0)));
    scene.addObject(new Raytracer::Sphere(Vec3f(0,0,-55),10));
    Raytracer::Image render(1000,1000);
    scene.start(render);
    render.Save("./file1.ppm");
    return 0;
}